

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetPropertyValueInfo
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          PropertyValueInfo *info,RecyclableObject *instance,
          SimpleDictionaryPropertyDescriptor<int> *descriptor)

{
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = instance;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    if (((ulong)*descriptor & 6) != 2) {
      *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor)
    {
        SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
        if (descriptor->IsOrMayBecomeFixed())
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
    }